

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

TypeRef __thiscall clickhouse::Block::Iterator::Type(Iterator *this)

{
  long *in_RSI;
  element_type *in_RDI;
  TypeRef TVar1;
  Column *in_stack_ffffffffffffffd8;
  
  std::vector<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>::
  operator[]((vector<clickhouse::Block::ColumnItem,_std::allocator<clickhouse::Block::ColumnItem>_>
              *)(*in_RSI + 8),in_RSI[1]);
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x249fdc);
  TVar1 = clickhouse::Column::Type(in_stack_ffffffffffffffd8);
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Block::Iterator::Type() const {
    return block_.columns_[idx_].column->Type();
}